

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Program.cpp
# Opt level: O2

CRuntimeFunctionPtr __thiscall
Refal2::CGlobalFunctionData::RuntimeFunction(CGlobalFunctionData *this,CProgramPtr *program)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *_embeddedFunction;
  TRuntimeModuleId _runtimeModuleId;
  CEmbeddedFunction *this_01;
  CPreparatoryFunction *pCVar1;
  COrdinaryFunction *this_02;
  TOperationAddress _firstOperation;
  long *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  CRuntimeFunctionPtr CVar2;
  __shared_ptr<Refal2::CRuntimeFunction,_(__gnu_cxx::_Lock_policy)2> _Stack_38;
  
  this_00 = &program[1].super___shared_ptr<Refal2::CProgram,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ;
  if (program[1].super___shared_ptr<Refal2::CProgram,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    _embeddedFunction =
         (program->super___shared_ptr<Refal2::CProgram,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
         _M_pi;
    if (_embeddedFunction == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if ((program->super___shared_ptr<Refal2::CProgram,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
          (element_type *)0x0) {
        __assert_fail("IsPreparatoryFunction()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/Program.cpp"
                      ,0x8e,
                      "CRuntimeFunctionPtr Refal2::CGlobalFunctionData::RuntimeFunction(const CProgramPtr &) const"
                     );
      }
      pCVar1 = PreparatoryFunction((CGlobalFunctionData *)program);
      if (pCVar1->type == PFT_Empty) {
        std::__shared_ptr<Refal2::CRuntimeFunction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&_Stack_38,
                   (__shared_ptr<Refal2::CRuntimeFunction,_(__gnu_cxx::_Lock_policy)2> *)
                   (*in_RDX + 0x38));
        std::__shared_ptr<Refal2::CRuntimeFunction,_(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<Refal2::CRuntimeFunction,_(__gnu_cxx::_Lock_policy)2> *)this_00,
                   &_Stack_38);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_38._M_refcount);
      }
      else {
        this_02 = (COrdinaryFunction *)operator_new(0x18);
        pCVar1 = PreparatoryFunction((CGlobalFunctionData *)program);
        _firstOperation = CPreparatoryFunction::FirstOperation(pCVar1);
        _runtimeModuleId = RuntimeModuleId((CGlobalFunctionData *)program);
        COrdinaryFunction::COrdinaryFunction(this_02,_firstOperation,_runtimeModuleId);
        std::__shared_ptr<Refal2::CRuntimeFunction,_(__gnu_cxx::_Lock_policy)2>::
        reset<Refal2::COrdinaryFunction>
                  ((__shared_ptr<Refal2::CRuntimeFunction,_(__gnu_cxx::_Lock_policy)2> *)this_00,
                   this_02);
      }
    }
    else {
      this_01 = (CEmbeddedFunction *)operator_new(0x10);
      CEmbeddedFunction::CEmbeddedFunction(this_01,(TEmbeddedFunctionPtr)_embeddedFunction);
      std::__shared_ptr<Refal2::CRuntimeFunction,_(__gnu_cxx::_Lock_policy)2>::
      reset<Refal2::CEmbeddedFunction>
                ((__shared_ptr<Refal2::CRuntimeFunction,_(__gnu_cxx::_Lock_policy)2> *)this_00,
                 this_01);
    }
  }
  std::__shared_ptr<Refal2::CRuntimeFunction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<Refal2::CRuntimeFunction,_(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<Refal2::CRuntimeFunction,_(__gnu_cxx::_Lock_policy)2> *)this_00);
  CVar2.super___shared_ptr<Refal2::CRuntimeFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  CVar2.super___shared_ptr<Refal2::CRuntimeFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (CRuntimeFunctionPtr)
         CVar2.super___shared_ptr<Refal2::CRuntimeFunction,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

CRuntimeFunctionPtr CGlobalFunctionData::RuntimeFunction(
	const CProgramPtr& program ) const
{
	if( !static_cast<bool>( runtimeFunction ) ) {
		if( IsEmbeddedFunction() ) {
			runtimeFunction.reset( new CEmbeddedFunction(
				embeddedFunction ) );
		} else {
			assert( IsPreparatoryFunction() );
			if( PreparatoryFunction()->IsEmpty() ) {
				runtimeFunction = program->EmptyFunction();
			} else {
				runtimeFunction.reset( new COrdinaryFunction(
					PreparatoryFunction()->FirstOperation(),
					RuntimeModuleId() ) );
			}
		}
	}
	return runtimeFunction;
}